

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzblockdiag.cpp
# Opt level: O2

int __thiscall
TPZBlockDiagonal<double>::Substitution(TPZBlockDiagonal<double> *this,TPZFMatrix<double> *B)

{
  long lVar1;
  long lVar2;
  double *pdVar3;
  long col;
  long rows;
  long lVar4;
  long lVar5;
  long local_e0;
  TPZFMatrix<double> BTemp;
  
  if ((this->super_TPZMatrix<double>).super_TPZBaseMatrix.fDecomposed != '\x01') {
    TPZMatrix<double>::Error
              ("virtual int TPZBlockDiagonal<double>::Substitution(TPZFMatrix<TVar> *) const [TVar = double]"
               ,"TPZBlockDiagonal::Decompose_LU is decomposed with other scheme");
  }
  lVar4 = (this->fBlockSize).fNElements;
  lVar2 = (B->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol;
  col = 0;
  if (lVar4 < 1) {
    lVar4 = col;
  }
  if (lVar2 < 1) {
    lVar2 = col;
  }
  for (; col != lVar2; col = col + 1) {
    local_e0 = 0;
    for (lVar5 = 0; lVar4 != lVar5; lVar5 = lVar5 + 1) {
      rows = (long)(this->fBlockSize).fStore[lVar5];
      if (rows != 0) {
        lVar1 = (this->fBlockPos).fStore[lVar5];
        pdVar3 = TPZFMatrix<double>::operator()(B,local_e0,col);
        TPZFMatrix<double>::TPZFMatrix(&BTemp,rows,1,pdVar3,rows);
        pdVar3 = TPZVec<double>::begin(&this->fStorage);
        TPZFMatrix<double>::Substitution(pdVar3 + lVar1,rows,&BTemp);
        local_e0 = local_e0 + rows;
        TPZFMatrix<double>::~TPZFMatrix(&BTemp);
      }
    }
  }
  return 1;
}

Assistant:

int
TPZBlockDiagonal<TVar>::Substitution( TPZFMatrix<TVar> *B) const
{
	if(this->fDecomposed != ELU) {
		TPZMatrix<TVar>::Error(__PRETTY_FUNCTION__,"TPZBlockDiagonal::Decompose_LU is decomposed with other scheme");
	}
	
	int64_t b,nb,pos,bsize,eq=0;
	nb = fBlockSize.NElements();
	int64_t c, nc = B->Cols();
	for(c=0; c<nc; c++) {
		eq = 0;
		for(b=0;b<nb; b++) {
			pos = fBlockPos[b];
			bsize = fBlockSize[b];
			if(!bsize) continue;
			TPZFMatrix<TVar> BTemp(bsize,1,&(B->operator()(eq,c)),bsize);
			TVar *ptr = fStorage.begin()+pos;
			TPZFMatrix<TVar>::Substitution(ptr,bsize,&BTemp);
			eq+= bsize;
		}
	}
	return 1;
}